

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_4::randomizeDrawOp(Random *rnd,DrawPrimitiveOp *drawOp)

{
  bool bVar1;
  PrimitiveType PVar2;
  int iVar3;
  BlendMode BVar4;
  DepthMode DVar5;
  StencilMode SVar6;
  reference pvVar7;
  reference pvVar8;
  float *pfVar9;
  reference p2_00;
  float fVar10;
  float fVar11;
  float fVar12;
  Vec4 *p2;
  Vec4 *p1;
  Vec4 *p0;
  int numAttempts;
  int maxAttempts;
  Vec4 *color;
  Vec4 *position;
  int coordNdx;
  float cy;
  float cx;
  int triNdx;
  float maxAlpha;
  float minAlpha;
  float maxRGB;
  float minRGB;
  float maxDepth;
  float minDepth;
  float maxTriOffset;
  int maxPrimitives;
  int minPrimitives;
  int maxStencilRef;
  int minStencilRef;
  DrawPrimitiveOp *drawOp_local;
  Random *rnd_local;
  
  PVar2 = de::Random::getInt(rnd,0,0);
  drawOp->type = PVar2;
  iVar3 = de::Random::getInt(rnd,2,4);
  drawOp->count = iVar3;
  BVar4 = de::Random::getInt(rnd,0,2);
  drawOp->blend = BVar4;
  DVar5 = de::Random::getInt(rnd,0,1);
  drawOp->depth = DVar5;
  SVar6 = de::Random::getInt(rnd,0,1);
  drawOp->stencil = SVar6;
  iVar3 = de::Random::getInt(rnd,0,8);
  drawOp->stencilRef = iVar3;
  if (drawOp->type == PRIMITIVETYPE_TRIANGLE) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&drawOp->positions,(long)(drawOp->count * 3));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&drawOp->colors,(long)(drawOp->count * 3));
    for (cy = 0.0; (int)cy < drawOp->count; cy = (float)((int)cy + 1)) {
      fVar10 = de::Random::getFloat(rnd,-1.0,1.0);
      fVar11 = de::Random::getFloat(rnd,-1.0,1.0);
      for (position._4_4_ = 0; position._4_4_ < 3; position._4_4_ = position._4_4_ + 1) {
        pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](&drawOp->positions,(long)((int)cy * 3 + position._4_4_));
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](&drawOp->colors,(long)((int)cy * 3 + position._4_4_));
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::x(pvVar7);
        *pfVar9 = fVar10 + fVar12;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::y(pvVar7);
        *pfVar9 = fVar11 + fVar12;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::z(pvVar7);
        *pfVar9 = fVar12;
        pfVar9 = tcu::Vector<float,_4>::w(pvVar7);
        *pfVar9 = 1.0;
        fVar12 = de::Random::getFloat(rnd,0.2,0.9);
        pfVar9 = tcu::Vector<float,_4>::x(pvVar8);
        *pfVar9 = fVar12;
        fVar12 = de::Random::getFloat(rnd,0.2,0.9);
        pfVar9 = tcu::Vector<float,_4>::y(pvVar8);
        *pfVar9 = fVar12;
        fVar12 = de::Random::getFloat(rnd,0.2,0.9);
        pfVar9 = tcu::Vector<float,_4>::z(pvVar8);
        *pfVar9 = fVar12;
        fVar12 = de::Random::getFloat(rnd,0.3,1.0);
        pfVar9 = tcu::Vector<float,_4>::w(pvVar8);
        *pfVar9 = fVar12;
      }
      p0._0_4_ = 0;
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&drawOp->positions,(long)((int)cy * 3));
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&drawOp->positions,(long)((int)cy * 3 + 1));
      p2_00 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&drawOp->positions,(long)((int)cy * 3 + 2));
      do {
        bVar1 = isANarrowScreenSpaceTriangle(pvVar7,pvVar8,p2_00);
        if (!bVar1) break;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::x(pvVar8);
        *pfVar9 = fVar10 + fVar12;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::y(pvVar8);
        *pfVar9 = fVar11 + fVar12;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::z(pvVar8);
        *pfVar9 = fVar12;
        pfVar9 = tcu::Vector<float,_4>::w(pvVar8);
        *pfVar9 = 1.0;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::x(p2_00);
        *pfVar9 = fVar10 + fVar12;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::y(p2_00);
        *pfVar9 = fVar11 + fVar12;
        fVar12 = de::Random::getFloat(rnd,-1.0,1.0);
        pfVar9 = tcu::Vector<float,_4>::z(p2_00);
        *pfVar9 = fVar12;
        pfVar9 = tcu::Vector<float,_4>::w(p2_00);
        *pfVar9 = 1.0;
        p0._0_4_ = (int)p0 + 1;
      } while ((int)p0 < 0x29);
    }
  }
  return;
}

Assistant:

void randomizeDrawOp (de::Random& rnd, DrawPrimitiveOp& drawOp)
{
	const int	minStencilRef	= 0;
	const int	maxStencilRef	= 8;
	const int	minPrimitives	= 2;
	const int	maxPrimitives	= 4;

	const float	maxTriOffset	= 1.0f;
	const float	minDepth		= -1.0f; // \todo [pyry] Reference doesn't support Z clipping yet
	const float	maxDepth		= 1.0f;

	const float	minRGB			= 0.2f;
	const float	maxRGB			= 0.9f;
	const float	minAlpha		= 0.3f;
	const float	maxAlpha		= 1.0f;

	drawOp.type			= (PrimitiveType)rnd.getInt(0, PRIMITIVETYPE_LAST-1);
	drawOp.count		= rnd.getInt(minPrimitives, maxPrimitives);
	drawOp.blend		= (BlendMode)rnd.getInt(0, BLENDMODE_LAST-1);
	drawOp.depth		= (DepthMode)rnd.getInt(0, DEPTHMODE_LAST-1);
	drawOp.stencil		= (StencilMode)rnd.getInt(0, STENCILMODE_LAST-1);
	drawOp.stencilRef	= rnd.getInt(minStencilRef, maxStencilRef);

	if (drawOp.type == PRIMITIVETYPE_TRIANGLE)
	{
		drawOp.positions.resize(drawOp.count*3);
		drawOp.colors.resize(drawOp.count*3);

		for (int triNdx = 0; triNdx < drawOp.count; triNdx++)
		{
			const float		cx		= rnd.getFloat(-1.0f, 1.0f);
			const float		cy		= rnd.getFloat(-1.0f, 1.0f);

			for (int coordNdx = 0; coordNdx < 3; coordNdx++)
			{
				tcu::Vec4&	position	= drawOp.positions[triNdx*3 + coordNdx];
				tcu::Vec4&	color		= drawOp.colors[triNdx*3 + coordNdx];

				position.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.z()	= rnd.getFloat(minDepth, maxDepth);
				position.w()	= 1.0f;

				color.x()		= rnd.getFloat(minRGB, maxRGB);
				color.y()		= rnd.getFloat(minRGB, maxRGB);
				color.z()		= rnd.getFloat(minRGB, maxRGB);
				color.w()		= rnd.getFloat(minAlpha, maxAlpha);
			}

			// avoid generating narrow triangles
			{
				const int	maxAttempts	= 40;
				int			numAttempts	= 0;
				tcu::Vec4&	p0			= drawOp.positions[triNdx*3 + 0];
				tcu::Vec4&	p1			= drawOp.positions[triNdx*3 + 1];
				tcu::Vec4&	p2			= drawOp.positions[triNdx*3 + 2];

				while (isANarrowScreenSpaceTriangle(p0, p1, p2))
				{
					p1.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.z()	= rnd.getFloat(minDepth, maxDepth);
					p1.w()	= 1.0f;

					p2.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.z()	= rnd.getFloat(minDepth, maxDepth);
					p2.w()	= 1.0f;

					if (++numAttempts > maxAttempts)
					{
						DE_ASSERT(false);
						break;
					}
				}
			}
		}
	}
	else
		DE_ASSERT(false);
}